

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void writeJson(char *fout,CUPDLPwork *work)

{
  ulong uVar1;
  FILE *__stream;
  
  puts("--------------------------------");
  printf("--- saving to %s\n",fout);
  puts("--------------------------------");
  __stream = fopen(fout,"w");
  fputc(0x7b,__stream);
  fprintf(__stream,"\"solver\":\"%s\",","cuPDLP-C");
  fprintf(__stream,"\"nIter\":%d,",(ulong)(uint)work->timers->nIter);
  fprintf(__stream,"\"nAtyCalls\":%d,",(ulong)(uint)work->timers->nAtyCalls);
  fprintf(__stream,"\"nAxCalls\":%d,",(ulong)(uint)work->timers->nAxCalls);
  fprintf(__stream,"\"dSolvingBeg\":%f,",work->timers->dSolvingBeg);
  fprintf(__stream,"\"dSolvingTime\":%f,",work->timers->dSolvingTime);
  fprintf(__stream,"\"dPresolveTime\":%f,",work->timers->dPresolveTime);
  fprintf(__stream,"\"dScalingTime\":%f,",work->timers->dScalingTime);
  fprintf(__stream,"\"dPrimalObj\":%.14f,",work->resobj->dPrimalObj);
  fprintf(__stream,"\"dDualObj\":%.14f,",work->resobj->dDualObj);
  fprintf(__stream,"\"dPrimalFeas\":%.14f,",work->resobj->dPrimalFeas);
  fprintf(__stream,"\"dDualFeas\":%.14f,",work->resobj->dDualFeas);
  fprintf(__stream,"\"dPrimalObjAverage\":%.14f,",work->resobj->dPrimalObjAverage);
  fprintf(__stream,"\"dDualObjAverage\":%.14f,",work->resobj->dDualObjAverage);
  fprintf(__stream,"\"dPrimalFeasAverage\":%.14f,",work->resobj->dPrimalFeasAverage);
  fprintf(__stream,"\"dDualFeasAverage\":%.14f,",work->resobj->dDualFeasAverage);
  fprintf(__stream,"\"dDualityGap\":%.14f,",work->resobj->dDualityGap);
  fprintf(__stream,"\"dDualityGapAverage\":%.14f,",work->resobj->dDualityGapAverage);
  uVar1 = (ulong)(work->resobj->termIterate == AVERAGE_ITERATE);
  fprintf(__stream,"\"dRelPrimalFeas\":%.14f,",
          (&work->resobj->dPrimalFeas)[uVar1 * 0x20] / (work->scaling->dNormRhs + 1.0));
  fprintf(__stream,"\"dRelDualFeas\":%.14f,",
          (&work->resobj->dDualFeas)[uVar1 * 0x20] / (work->scaling->dNormCost + 1.0));
  fprintf(__stream,"\"dRelDualityGap\":%.14f,",(&work->resobj->dRelObjGap)[uVar1 * 0x20]);
  fprintf(__stream,"\"terminationCode\":\"%s\",",termCodeNames[work->resobj->termCode]);
  fprintf(__stream,"\"terminationIterate\":\"%s\",",termIterateNames[work->resobj->termIterate]);
  fprintf(__stream,"\"primalCode\":\"%s\",",termCodeNames[work->resobj->primalCode]);
  fprintf(__stream,"\"dualCode\":\"%s\",",termCodeNames[work->resobj->dualCode]);
  fprintf(__stream,"\"terminationInfeasIterate\":\"%s\"",
          termIterateNames[work->resobj->termInfeasIterate]);
  fputc(0x7d,__stream);
  fclose(__stream);
  return;
}

Assistant:

void writeJson(const char *fout, CUPDLPwork *work) {
  FILE *fptr;

  cupdlp_printf("--------------------------------\n");
  cupdlp_printf("--- saving to %s\n", fout);
  cupdlp_printf("--------------------------------\n");
  // Open a file in writing mode
  fptr = fopen(fout, "w");

  fprintf(fptr, "{");

  // solver
  fprintf(fptr, "\"solver\":\"%s\",", "cuPDLP-C");

  // timers
  fprintf(fptr, "\"nIter\":%d,", work->timers->nIter);
  fprintf(fptr, "\"nAtyCalls\":%d,", work->timers->nAtyCalls);
  fprintf(fptr, "\"nAxCalls\":%d,", work->timers->nAxCalls);
  fprintf(fptr, "\"dSolvingBeg\":%f,", work->timers->dSolvingBeg);
  fprintf(fptr, "\"dSolvingTime\":%f,", work->timers->dSolvingTime);
  fprintf(fptr, "\"dPresolveTime\":%f,", work->timers->dPresolveTime);
  fprintf(fptr, "\"dScalingTime\":%f,", work->timers->dScalingTime);
#ifndef CUPDLP_CPU
  fprintf(fptr, "\"AllocMem_CopyMatToDeviceTime\":%f,",
          work->timers->AllocMem_CopyMatToDeviceTime);
  fprintf(fptr, "\"CopyVecToDeviceTime\":%f,",
          work->timers->CopyVecToDeviceTime);
  fprintf(fptr, "\"CopyVecToHostTime\":%f,", work->timers->CopyVecToHostTime);
  fprintf(fptr, "\"DeviceMatVecProdTime\":%f,",
          work->timers->DeviceMatVecProdTime);
#endif
  // residuals
  fprintf(fptr, "\"dPrimalObj\":%.14f,", work->resobj->dPrimalObj);
  fprintf(fptr, "\"dDualObj\":%.14f,", work->resobj->dDualObj);
  fprintf(fptr, "\"dPrimalFeas\":%.14f,", work->resobj->dPrimalFeas);
  fprintf(fptr, "\"dDualFeas\":%.14f,", work->resobj->dDualFeas);
  fprintf(fptr, "\"dPrimalObjAverage\":%.14f,",
          work->resobj->dPrimalObjAverage);
  fprintf(fptr, "\"dDualObjAverage\":%.14f,", work->resobj->dDualObjAverage);
  fprintf(fptr, "\"dPrimalFeasAverage\":%.14f,",
          work->resobj->dPrimalFeasAverage);
  fprintf(fptr, "\"dDualFeasAverage\":%.14f,", work->resobj->dDualFeasAverage);
  fprintf(fptr, "\"dDualityGap\":%.14f,", work->resobj->dDualityGap);
  fprintf(fptr, "\"dDualityGapAverage\":%.14f,",
          work->resobj->dDualityGapAverage);
  // fprintf(fptr, "\"dComplementarity\":%.14f,",
  // work->resobj->dComplementarity); fprintf(fptr,
  // "\"dComplementarityAverage\":%.14f,",
  //         work->resobj->dComplementarityAverage);

  //  todo should this be added to postsolve?
  // todo, fix dNormCost and this
  if (work->resobj->termIterate == AVERAGE_ITERATE) {
    fprintf(fptr, "\"dRelPrimalFeas\":%.14f,",
            work->resobj->dPrimalFeasAverage / (1.0 + work->scaling->dNormRhs));
    fprintf(fptr, "\"dRelDualFeas\":%.14f,",
            work->resobj->dDualFeasAverage / (1.0 + work->scaling->dNormCost));
    fprintf(fptr, "\"dRelDualityGap\":%.14f,", work->resobj->dRelObjGapAverage);
  } else {
    fprintf(fptr, "\"dRelPrimalFeas\":%.14f,",
            work->resobj->dPrimalFeas / (1.0 + work->scaling->dNormRhs));
    fprintf(fptr, "\"dRelDualFeas\":%.14f,",
            work->resobj->dDualFeas / (1.0 + work->scaling->dNormCost));
    fprintf(fptr, "\"dRelDualityGap\":%.14f,", work->resobj->dRelObjGap);
  }
  fprintf(fptr, "\"terminationCode\":\"%s\",",
          termCodeNames[work->resobj->termCode]);
  fprintf(fptr, "\"terminationIterate\":\"%s\",",
          termIterateNames[work->resobj->termIterate]);
  fprintf(fptr, "\"primalCode\":\"%s\",",
          termCodeNames[work->resobj->primalCode]);
  fprintf(fptr, "\"dualCode\":\"%s\",", termCodeNames[work->resobj->dualCode]);
  fprintf(fptr, "\"terminationInfeasIterate\":\"%s\"",
          termIterateNames[work->resobj->termInfeasIterate]);

  fprintf(fptr, "}");
  // Close the file
  fclose(fptr);
}